

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_refine_qualities.cpp
# Opt level: O0

void __thiscall
Omega_h::MetricRefineQualities<3,_1>::MetricRefineQualities
          (MetricRefineQualities<3,_1> *this,Mesh *mesh,LOs *candidates)

{
  LOs *mesh_00;
  LOs *pLVar1;
  allocator local_99;
  string local_98 [32];
  undefined1 local_78 [56];
  string local_40 [32];
  pointer local_20;
  LOs *candidates_local;
  Mesh *mesh_local;
  MetricRefineQualities<3,_3> *this_local;
  
  local_20 = (pointer)candidates;
  candidates_local = (LOs *)mesh;
  mesh_local = (Mesh *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"metric",(allocator *)(local_78 + 0x37));
  Omega_h::Mesh::get_array<double>((Mesh *)this,(Int)mesh,(string *)0x0);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)(local_78 + 0x37));
  mesh_00 = candidates_local;
  Read<int>::Read((Read<int> *)(local_78 + 0x10),candidates);
  pLVar1 = candidates_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"metric",&local_99);
  Omega_h::Mesh::get_array<double>((Mesh *)local_78,(Int)pLVar1,(string *)0x0);
  get_mident_metrics((Omega_h *)(this + 0x10),(Mesh *)mesh_00,1,(LOs *)(local_78 + 0x10),
                     (Reals *)local_78,false);
  Read<double>::~Read((Read<double> *)local_78);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  Read<int>::~Read((Read<int> *)(local_78 + 0x10));
  return;
}

Assistant:

MetricRefineQualities(Mesh* mesh, LOs candidates)
      : vert_metrics(mesh->get_array<Real>(VERT, "metric")),
        /* TODO: we could reuse the results of this instead of recomputing
         * them when transferring an OMEGA_H_METRIC field in transfer.cpp
         */
        midpt_metrics(get_mident_metrics(
            mesh, EDGE, candidates, mesh->get_array<Real>(VERT, "metric"))) {}